

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O3

void __thiscall CMU462::EdgeRecord::EdgeRecord(EdgeRecord *this,EdgeIter *_edge)

{
  _List_node_base *p_Var1;
  undefined1 auVar2 [16];
  Vector3D *pVVar3;
  double *pdVar4;
  Vector3D *pVVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  _List_node_base *p_Var10;
  double dVar11;
  double dVar12;
  _List_node_base *p_Var13;
  _List_node_base *p_Var14;
  _List_node_base *p_Var15;
  _List_node_base *p_Var16;
  _List_node_base *p_Var17;
  double dVar18;
  double dVar19;
  Matrix3x3 A;
  Matrix4x4 K;
  double A_data [9];
  double local_288;
  undefined8 uStack_280;
  Vector3D local_278;
  double local_258;
  double dStack_250;
  double local_248;
  double local_238;
  double dStack_230;
  _List_node_base *local_228;
  undefined8 uStack_220;
  Vector3D local_218;
  Vector3D *local_200;
  Matrix3x3 local_1f8;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  double dStack_170;
  _List_node_base *local_168;
  undefined8 uStack_160;
  _List_node_base *local_158;
  _List_node_base *p_Stack_150;
  Matrix3x3 local_140;
  Matrix4x4 local_f8;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  p_Var1 = _edge->_M_node;
  (this->edge)._M_node = p_Var1;
  pVVar5 = &this->optimalPoint;
  (this->optimalPoint).x = 0.0;
  (this->optimalPoint).y = 0.0;
  (this->optimalPoint).z = 0.0;
  this->score = 0.0;
  p_Var1 = p_Var1[5]._M_prev;
  Matrix4x4::operator+
            (&local_f8,(Matrix4x4 *)&p_Var1[2]._M_next[4]._M_prev,
             (Matrix4x4 *)&p_Var1[1]._M_next[2]._M_next[4]._M_prev);
  pdVar4 = Matrix4x4::operator()(&local_f8,0,0);
  local_78 = *pdVar4;
  pdVar4 = Matrix4x4::operator()(&local_f8,0,1);
  local_70 = *pdVar4;
  pdVar4 = Matrix4x4::operator()(&local_f8,0,2);
  local_68 = *pdVar4;
  pdVar4 = Matrix4x4::operator()(&local_f8,1,0);
  local_60 = *pdVar4;
  pdVar4 = Matrix4x4::operator()(&local_f8,1,1);
  local_58 = *pdVar4;
  pdVar4 = Matrix4x4::operator()(&local_f8,1,2);
  local_50 = *pdVar4;
  pdVar4 = Matrix4x4::operator()(&local_f8,2,0);
  local_48 = *pdVar4;
  pdVar4 = Matrix4x4::operator()(&local_f8,2,1);
  local_40 = *pdVar4;
  pdVar4 = Matrix4x4::operator()(&local_f8,2,2);
  local_38 = *pdVar4;
  Matrix3x3::Matrix3x3(&local_140,&local_78);
  pdVar4 = Matrix4x4::operator()(&local_f8,0,3);
  local_288 = *pdVar4;
  pdVar4 = Matrix4x4::operator()(&local_f8,1,3);
  uVar7 = SUB84(*pdVar4,0);
  uStack_280._0_4_ = uVar7;
  uStack_280._4_4_ = (int)((ulong)*pdVar4 >> 0x20);
  pdVar4 = Matrix4x4::operator()(&local_f8,2,3);
  local_238 = -*pdVar4;
  local_288 = -local_288;
  dVar12 = -uStack_280;
  dStack_230 = -0.0;
  local_218.x = local_288;
  local_218.y = dVar12;
  local_218.z = local_238;
  dVar18 = Matrix3x3::det(&local_140);
  if (dVar18 <= 0.01) {
    p_Var16 = p_Var1[2]._M_next;
    local_1f8.entries[0].x = (double)p_Var16[1]._M_next;
    local_1f8.entries[0].y = (double)p_Var16[1]._M_prev;
    local_1f8.entries[0].z = (double)p_Var16[2]._M_next;
    p_Var1 = p_Var1[1]._M_next[2]._M_next;
    local_278.x = (double)p_Var1[1]._M_next;
    local_278.y = (double)p_Var1[1]._M_prev;
    local_278.z = (double)p_Var1[2]._M_next;
    local_200 = pVVar5;
    if (0.0001 < (local_1f8.entries[0].z - local_278.z) * (local_1f8.entries[0].z - local_278.z) +
                 (local_1f8.entries[0].x - local_278.x) * (local_1f8.entries[0].x - local_278.x) +
                 (local_1f8.entries[0].y - local_278.y) * (local_1f8.entries[0].y - local_278.y)) {
      dStack_230 = local_238;
      auVar2._8_4_ = uVar7;
      auVar2._0_8_ = dVar12;
      auVar2._12_4_ = (int)((ulong)dVar12 >> 0x20);
      local_1a8 = local_288;
      dStack_1a0 = local_288;
      do {
        Matrix3x3::operator*(&local_140,local_1f8.entries);
        local_158 = (_List_node_base *)local_1f8.entries[0].x;
        p_Stack_150 = (_List_node_base *)local_1f8.entries[0].y;
        local_178 = local_258;
        dStack_170 = dStack_250;
        local_198 = dStack_250;
        dStack_190 = local_248;
        local_168 = (_List_node_base *)local_1f8.entries[0].y;
        uStack_160 = 0;
        local_228 = (_List_node_base *)local_1f8.entries[0].z;
        uStack_220 = 0;
        local_188 = local_248;
        uStack_180 = 0;
        Matrix3x3::operator*(&local_140,&local_278);
        uStack_280 = auVar2._8_8_;
        dVar18 = (double)local_228 * local_238 +
                 (double)local_158 * local_1a8 + (double)local_168 * dVar12;
        dVar19 = local_278.z * dStack_230 + local_278.x * dStack_1a0 + local_278.y * uStack_280;
        p_Var1 = (_List_node_base *)((local_278.x + local_1f8.entries[0].x) * 0.5);
        p_Var16 = (_List_node_base *)((local_278.y + local_1f8.entries[0].y) * 0.5);
        p_Var17 = (_List_node_base *)((local_278.z + local_1f8.entries[0].z) * 0.5);
        if ((local_188 * (double)local_228 +
            local_178 * (double)local_158 + local_198 * (double)local_168) - (dVar18 + dVar18) <=
            (local_248 * local_278.z + local_258 * local_278.x + dStack_250 * local_278.y) -
            (dVar19 + dVar19)) {
          pVVar5 = &local_278;
          p_Var10 = p_Var16;
          p_Var13 = p_Var17;
          p_Var14 = (_List_node_base *)local_1f8.entries[0].y;
          p_Var15 = (_List_node_base *)local_1f8.entries[0].z;
          local_278.x = (double)p_Var1;
          pVVar3 = &local_278;
        }
        else {
          pVVar5 = local_1f8.entries;
          p_Var10 = (_List_node_base *)local_278.y;
          p_Var13 = (_List_node_base *)local_278.z;
          p_Var14 = p_Var16;
          p_Var15 = p_Var17;
          local_1f8.entries[0].x = (double)p_Var1;
          pVVar3 = local_1f8.entries;
        }
        dVar18 = local_1f8.entries[0].x - local_278.x;
        pVVar5->y = (double)p_Var16;
        pVVar3->z = (double)p_Var17;
      } while (0.0001 < ((double)p_Var15 - (double)p_Var13) * ((double)p_Var15 - (double)p_Var13) +
                        dVar18 * dVar18 +
                        ((double)p_Var14 - (double)p_Var10) * ((double)p_Var14 - (double)p_Var10));
    }
    local_200->z = local_1f8.entries[0].z;
    pVVar5 = local_200;
    uVar7 = local_1f8.entries[0].x._0_4_;
    uVar6 = local_1f8.entries[0].x._4_4_;
    uVar8 = local_1f8.entries[0].y._0_4_;
    uVar9 = local_1f8.entries[0].y._4_4_;
  }
  else {
    Matrix3x3::inv(&local_1f8,&local_140);
    Matrix3x3::operator*(&local_1f8,&local_218);
    (this->optimalPoint).z = local_278.z;
    uVar7 = local_278.x._0_4_;
    uVar6 = local_278.x._4_4_;
    uVar8 = local_278.y._0_4_;
    uVar9 = local_278.y._4_4_;
  }
  *(undefined4 *)&pVVar5->x = uVar7;
  *(undefined4 *)((long)&pVVar5->x + 4) = uVar6;
  *(undefined4 *)&pVVar5->y = uVar8;
  *(undefined4 *)((long)&pVVar5->y + 4) = uVar9;
  Matrix3x3::operator*(&local_140,pVVar5);
  dVar18 = (this->optimalPoint).x;
  dVar12 = (this->optimalPoint).y;
  dVar19 = (this->optimalPoint).z;
  dVar11 = dVar19 * local_218.z + dVar18 * local_218.x + dVar12 * local_218.y;
  local_228 = (_List_node_base *)
              ((local_1f8.entries[0].z * dVar19 +
               local_1f8.entries[0].x * dVar18 + local_1f8.entries[0].y * dVar12) -
              (dVar11 + dVar11));
  pdVar4 = Matrix4x4::operator()(&local_f8,3,3);
  this->score = (double)local_228 + *pdVar4;
  return;
}

Assistant:

EdgeRecord::EdgeRecord(EdgeIter& _edge) : edge(_edge) {
  // Compute the combined quadric from the edge endpoints.

  auto h = edge->halfedge();
  auto K = h->vertex()->quadric + h->twin()->vertex()->quadric;

  // -> Build the 3x3 linear system whose solution minimizes the quadric error
  //    associated with these two endpoints.

  double A_data[9] = { K(0,0), K(0,1), K(0,2),
                       K(1,0), K(1,1), K(1,2),
                       K(2,0), K(2,1), K(2,2) };
  auto A = Matrix3x3(A_data);
  auto b = Vector3D(-K(0,3), -K(1,3), -K(2,3));

  // -> Use this system to solve for the optimal position, and store it in
  //    EdgeRecord::optimalPoint.

  if (A.det() > 0.01) {
    optimalPoint = A.inv() * b;
  } else {
//    cerr << "detA is too small: " << A.det() << endl;
//    cerr << "inverse answer: " << A.inv() * b << endl;

    auto p0 = h->vertex()->position, p1 = h->twin()->vertex()->position;
    while ((p0 - p1).norm2() > 0.0001) {
      auto c0 = dot(p0, A * p0) - 2 * dot(b, p0),
           c1 = dot(p1, A * p1) - 2 * dot(b, p1);
      if (c0 > c1) {
        p0 = (p0 + p1) / 2;
      } else {
        p1 = (p0 + p1) / 2;
      }
    }
    optimalPoint = p0;

//    cerr << "actual answer: " << optimalPoint << endl << endl;
  }

  // -> Also store the cost associated with collapsing this edg in
  //    EdgeRecord::Cost.

  score = dot(optimalPoint, A * optimalPoint) - 2 * dot(b, optimalPoint) + K(3,3);
}